

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O1

void __thiscall CGameClient::OnMessage(CGameClient *this,int MsgId,CUnpacker *pUnpacker)

{
  CNetObjHandler *this_00;
  int *piVar1;
  IClient *pIVar2;
  CComponent *pCVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  CNetMsg_De_ClientLeave *pCVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  _func_int **pp_Var15;
  int iVar16;
  ulong uVar17;
  char (*pacVar18) [97];
  char (*pacVar19) [97];
  CTuningParams *pCVar20;
  CSounds *this_01;
  CBroadcast *this_02;
  CChat *pCVar21;
  IConsole *pIVar22;
  CStats *pCVar23;
  long lVar24;
  uint i;
  CNetMsg_De_ClientLeave *pMsg;
  long in_FS_OFFSET;
  byte bVar25;
  float fVar26;
  char aLabel [64];
  char aBuf [256];
  int aParaI [3];
  char local_188 [64];
  CNetMsg_De_ClientLeave local_148;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_44 [3];
  long local_38;
  
  bVar25 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->m_pClient->super_IInterface)._vptr_IInterface[9])(this->m_pClient,1);
  if (MsgId != 0x15) {
    if (MsgId == 0xc) {
      iVar7 = CUnpacker::GetInt(pUnpacker);
      bVar4 = 0 < iVar7;
      if (0 < iVar7) {
        pcVar10 = CUnpacker::GetString(pUnpacker,2);
        if (pUnpacker->m_Error == 0) {
          iVar16 = 0;
          do {
            CVoting::AddOption(this->m_pVoting,pcVar10);
            if (iVar7 + -1 == iVar16) goto LAB_00183c95;
            pcVar10 = CUnpacker::GetString(pUnpacker,2);
            iVar16 = iVar16 + 1;
          } while (pUnpacker->m_Error == 0);
          bVar4 = iVar16 < iVar7;
        }
        if (bVar4) goto switchD_00183cfd_caseD_1;
      }
    }
    else if ((MsgId == 6) && (pIVar2 = this->m_pClient, pIVar2->m_State != 4)) {
      lVar24 = 0;
      (*(pIVar2->super_IInterface)._vptr_IInterface[9])(pIVar2,0);
      local_148.m_pName = (char *)0xc8000003e8;
      local_148.m_ClientID = 0x32;
      local_148._12_4_ = 0x528;
      local_148.m_pReason = (char *)0x1f4000004b0;
      uStack_130 = 0x5f00000096;
      local_128 = 0x1f4000009470;
      uStack_120 = 0x5dc0000012c;
      local_118 = 0xd6d800000032;
      uStack_110 = 0x8c00030d40;
      local_108 = 0x35b600000007d;
      uStack_100 = 0x7d000000c8;
      local_f8 = 0x5000043238;
      uStack_f0 = 0x2bc00000014;
      local_e8 = 0xc8000186a0;
      uStack_e0 = 0x3a9800013880;
      local_d8 = 100;
      uStack_d0 = 0x6400000064;
      do {
        iVar7 = CUnpacker::GetInt(pUnpacker);
        *(int *)((long)&local_148.m_pName + lVar24 * 4) = iVar7;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0x20);
      if (pUnpacker->m_Error == 0) {
        this->m_ServerMode = 0;
        pCVar11 = &local_148;
        pCVar20 = &this->m_Tuning;
        for (lVar24 = 0x10; lVar24 != 0; lVar24 = lVar24 + -1) {
          *(char **)pCVar20 = pCVar11->m_pName;
          pCVar11 = (CNetMsg_De_ClientLeave *)((long)pCVar11 + ((ulong)bVar25 * -2 + 1) * 8);
          pCVar20 = (CTuningParams *)((long)pCVar20 + (ulong)bVar25 * -0x10 + 8);
        }
      }
      goto switchD_00183cfd_caseD_1;
    }
    goto LAB_00183c95;
  }
  uVar8 = CUnpacker::GetInt(pUnpacker);
  if (10 < uVar8) goto switchD_00183cfd_caseD_1;
  iVar7 = gs_GameMsgList[uVar8].m_ParaType;
  if (((iVar7 == 3) || (iVar7 == 2)) || (iVar7 == 1)) {
    bVar4 = true;
    bVar5 = false;
  }
  else {
    bVar4 = false;
    bVar5 = true;
    iVar7 = 0;
  }
  if (bVar4) {
    uVar17 = 0;
    do {
      uVar9 = CUnpacker::GetInt(pUnpacker);
      local_44[uVar17] = uVar9;
      uVar17 = uVar17 + 1;
    } while (iVar7 + (uint)(iVar7 == 0) != uVar17);
  }
  if (pUnpacker->m_Error != 0) goto switchD_00183cfd_caseD_1;
  iVar7 = gs_GameMsgList[uVar8].m_Action;
  if (iVar7 != 2) {
    if (bVar5) {
      pCVar11 = (CNetMsg_De_ClientLeave *)Localize(gs_GameMsgList[uVar8].m_pText,"");
    }
    else {
      pCVar11 = (CNetMsg_De_ClientLeave *)0x1e33dc;
    }
    if (iVar7 == 1) {
LAB_00183c00:
      this_02 = this->m_pBroadcast;
LAB_00183c07:
      CBroadcast::DoClientBroadcast(this_02,(char *)pCVar11);
    }
    else if (iVar7 == 0) {
      pCVar21 = this->m_pChat;
      goto LAB_00183c7a;
    }
    goto LAB_00183c8c;
  }
  if (6 < uVar8 - 4) goto LAB_00183c8c;
  uVar9 = (this->m_GameInfo).m_GameFlags;
  switch(uVar8) {
  case 4:
    this_01 = this->m_pSounds;
    iVar16 = 0x23;
    break;
  case 5:
    this_01 = this->m_pSounds;
    iVar16 = 0x24;
    break;
  case 6:
    if ((uVar9 & 1) == 0) {
      uVar17 = (ulong)(local_44[0] != 0) * 3;
    }
    else {
      uVar17 = 1;
      if (local_44[0] != 0) {
        uVar17 = (ulong)(local_44[0] == 1) ^ 3;
      }
    }
    pCVar11 = (CNetMsg_De_ClientLeave *)
              Localize(&DAT_001df054 + *(int *)(&DAT_001df054 + uVar17 * 4),"");
    this_02 = this->m_pBroadcast;
    goto LAB_00183c07;
  case 7:
    if ((uVar9 & 1) == 0) {
      bVar25 = (local_44[0] != 0) * '\x03';
    }
    else {
      bVar25 = 1;
      if (local_44[0] != 0) {
        bVar25 = local_44[0] == 1 ^ 3;
      }
    }
    if (bVar25 == 1) {
      pcVar10 = "You were moved to the red team due to team balancing";
    }
    else {
      if (bVar25 != 2) {
        pCVar11 = (CNetMsg_De_ClientLeave *)0x1e33dc;
        goto LAB_00183c00;
      }
      pcVar10 = "You were moved to the blue team due to team balancing";
    }
    pCVar11 = (CNetMsg_De_ClientLeave *)Localize(pcVar10,"");
    goto LAB_00183c00;
  case 8:
    if (((long)this->m_LocalClientID == -1) ||
       ((this->m_aClients[this->m_LocalClientID].m_Team == local_44[0] &&
        (((this->m_Snap).m_SpecInfo.m_Active != true ||
         (((lVar24 = (long)(this->m_Snap).m_SpecInfo.m_SpectatorID, lVar24 == -1 ||
           (this->m_aClients[lVar24].m_Team == local_44[0])) &&
          ((iVar16 = (this->m_Snap).m_SpecInfo.m_SpecMode, local_44[0] == 0 || iVar16 != 2 &&
           (local_44[0] == 1 || iVar16 != 3)))))))))) {
      this_01 = this->m_pSounds;
      iVar16 = 0x26;
    }
    else {
      this_01 = this->m_pSounds;
      iVar16 = 0x25;
    }
    break;
  case 9:
    CSounds::Enqueue(this->m_pSounds,3,0x27);
    uVar8 = 0x3f;
    if ((int)local_44[1] < 0x3f) {
      uVar8 = local_44[1];
    }
    uVar9 = 0;
    if (0 < (int)uVar8) {
      uVar9 = uVar8;
    }
    CStats::OnFlagCapture(this->m_pStats,uVar9);
    GetPlayerLabel(this,local_188,0x40,uVar9,this->m_aClients[uVar9].m_aName);
    fVar26 = (float)(int)local_44[2] / (float)this->m_pClient->m_GameTickSpeed;
    if (fVar26 <= 60.0) {
      if (local_44[0] == 0) {
        pcVar10 = "The red flag was captured by \'%s\' (%.2f seconds)";
      }
      else {
        pcVar10 = "The blue flag was captured by \'%s\' (%.2f seconds)";
      }
      pcVar10 = Localize(pcVar10,"");
      str_format((char *)&local_148,0x100,pcVar10,SUB84((double)fVar26,0));
    }
    else {
      if (local_44[0] == 0) {
        pcVar10 = "The red flag was captured by \'%s\'";
      }
      else {
        pcVar10 = "The blue flag was captured by \'%s\'";
      }
      pcVar10 = Localize(pcVar10,"");
      str_format((char *)&local_148,0x100,pcVar10);
    }
    pCVar21 = this->m_pChat;
    pCVar11 = &local_148;
    goto LAB_00183c7a;
  case 10:
    uVar8 = 0x3f;
    if ((int)local_44[0] < 0x3f) {
      uVar8 = local_44[0];
    }
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    GetPlayerLabel(this,local_188,0x40,uVar8,this->m_aClients[uVar8].m_aName);
    pcVar10 = Localize("\'%s\' initiated a pause","");
    pCVar11 = &local_148;
    str_format((char *)pCVar11,0x100,pcVar10);
    pCVar21 = this->m_pChat;
LAB_00183c7a:
    CChat::AddLine(pCVar21,(char *)pCVar11,-1,0,-1);
    goto LAB_00183c8c;
  }
  CSounds::Enqueue(this_01,3,iVar16);
LAB_00183c8c:
  if (iVar7 == 2) goto switchD_00183cfd_caseD_1;
LAB_00183c95:
  this_00 = &this->m_NetObjHandler;
  piVar12 = (int *)CNetObjHandler::SecureUnpackMsg(this_00,MsgId,pUnpacker);
  if (piVar12 == (int *)0x0) {
    pcVar13 = CNetObjHandler::GetMsgName(this_00,MsgId);
    pcVar14 = CNetObjHandler::FailedMsgOn(this_00);
    pcVar10 = (char *)&local_148;
    str_format(pcVar10,0x100,"dropped weird message \'%s\' (%d), failed on \'%s\'",pcVar13,
               (ulong)(uint)MsgId,pcVar14);
    pIVar22 = this->m_pConsole;
    pp_Var15 = (pIVar22->super_IInterface)._vptr_IInterface;
    goto LAB_00183e16;
  }
  if (0 < (this->m_All).m_Num) {
    lVar24 = 0;
    do {
      pCVar3 = (this->m_All).m_paComponents[lVar24];
      (*pCVar3->_vptr_CComponent[0xb])(pCVar3,(ulong)(uint)MsgId,piVar12);
      lVar24 = lVar24 + 1;
    } while (lVar24 < (this->m_All).m_Num);
  }
  switch(MsgId + -4) {
  case 0:
    break;
  case 1:
  case 2:
  case 3:
  case 5:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0x11:
    goto switchD_00183cfd_caseD_1;
  case 4:
switchD_00183cfd_caseD_4:
    (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x11])();
    goto switchD_00183cfd_caseD_1;
  case 6:
switchD_00183cfd_caseD_6:
    iVar7 = *piVar12;
    this->m_aClients[iVar7].m_Emoticon = piVar12[1];
    this->m_aClients[iVar7].m_EmoticonStart = this->m_pClient->m_CurGameTick;
    goto switchD_00183cfd_caseD_1;
  case 0xd:
switchD_00183cfd_caseD_d:
    pIVar2 = this->m_pClient;
    if (pIVar2->m_State != 4) {
      (*(pIVar2->super_IInterface)._vptr_IInterface[9])(pIVar2,0);
      if ((this->m_ServerSettings).m_TeamLock == false) {
        if (piVar12[3] != 0) {
          pcVar10 = "Teams were locked";
          goto LAB_0018425e;
        }
      }
      else if (piVar12[3] == 0) {
        pcVar10 = "Teams were unlocked";
LAB_0018425e:
        pCVar21 = this->m_pChat;
        pcVar10 = Localize(pcVar10,"");
        CChat::AddLine(pCVar21,pcVar10,-1,0,-1);
      }
      (this->m_ServerSettings).m_KickVote = *piVar12 != 0;
      (this->m_ServerSettings).m_KickMin = piVar12[1];
      (this->m_ServerSettings).m_SpecVote = piVar12[2] != 0;
      (this->m_ServerSettings).m_TeamLock = piVar12[3] != 0;
      (this->m_ServerSettings).m_TeamBalance = piVar12[4] != 0;
      (this->m_ServerSettings).m_PlayerSlots = piVar12[5];
      goto switchD_00183cfd_caseD_1;
    }
    if (9 < MsgId) {
      if (MsgId == 10) goto switchD_00183cfd_caseD_6;
      if (MsgId == 0x16) goto switchD_00183cfd_caseD_12;
      goto LAB_001841e7;
    }
    if (MsgId != 4) {
      if (MsgId != 8) goto switchD_00183cfd_caseD_1;
      goto switchD_00183cfd_caseD_4;
    }
    break;
  case 0xe:
    pIVar2 = this->m_pClient;
    if (pIVar2->m_State == 4) {
      switch(MsgId + -4) {
      case 0:
        goto switchD_00183cfd_caseD_0;
      case 1:
      case 2:
      case 3:
      case 5:
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xe:
      case 0x11:
        goto switchD_00183cfd_caseD_1;
      case 4:
        goto switchD_00183cfd_caseD_4;
      case 6:
        goto switchD_00183cfd_caseD_6;
      case 0xd:
        goto switchD_00183cfd_caseD_d;
      case 0xf:
        goto switchD_00183cfd_caseD_f;
      case 0x10:
        goto switchD_00183cfd_caseD_10;
      case 0x12:
        goto switchD_00183cfd_caseD_12;
      case 0x13:
        goto switchD_00183cfd_caseD_13;
      default:
        goto switchD_00183cfd_default;
      }
    }
    (*(pIVar2->super_IInterface)._vptr_IInterface[9])(pIVar2,0);
    if (piVar12[1] == 0) {
      if (this->m_aClients[*piVar12].m_Active != true) {
        if ((this->m_LocalClientID != -1) && (piVar12[0x22] == 0)) {
          DoEnterMessage(this,*(char **)(piVar12 + 4),*piVar12,piVar12[2]);
          iVar7 = (*(this->m_pDemoRecorder->super_IInterface)._vptr_IInterface[2])();
          if ((char)iVar7 != '\0') {
            local_148.m_pName = *(char **)(piVar12 + 4);
            local_148._12_4_ = piVar12[2];
            local_148.m_ClientID = *piVar12;
            IClient::SendPackMsg<CNetMsg_De_ClientEnter>
                      (this->m_pClient,(CNetMsg_De_ClientEnter *)&local_148,0x18);
          }
        }
        goto LAB_001843fc;
      }
      if (this->m_pConfig->m_Debug == 0) goto switchD_00183cfd_caseD_1;
      pIVar22 = this->m_pConsole;
      pp_Var15 = (pIVar22->super_IInterface)._vptr_IInterface;
      pcVar10 = "invalid clientinfo";
    }
    else {
      if (this->m_LocalClientID == -1) {
        this->m_LocalClientID = *piVar12;
        this->m_TeamChangeTime = this->m_pClient->m_LocalTime;
LAB_001843fc:
        iVar7 = *piVar12;
        this->m_aClients[iVar7].m_Active = true;
        this->m_aClients[iVar7].m_Team = piVar12[2];
        str_utf8_copy_num(this->m_aClients[iVar7].m_aName,*(char **)(piVar12 + 4),0x41,0x10);
        str_utf8_copy_num(this->m_aClients[*piVar12].m_aClan,*(char **)(piVar12 + 6),0x31,0xc);
        this->m_aClients[*piVar12].m_Country = piVar12[8];
        pacVar18 = this->m_aClients[0].m_aaSkinPartNames;
        lVar24 = 0;
        pacVar19 = pacVar18;
        do {
          str_utf8_copy_num((char *)((long)*piVar12 * 0x5b0 + (long)pacVar19),
                            *(char **)((long)piVar12 + lVar24 * 2 + 0x28),0x61,0x18);
          *(undefined4 *)((long)pacVar18 + lVar24 + 0x248 + (long)*piVar12 * 0x5b0) =
               *(undefined4 *)((long)piVar12 + lVar24 + 0x58);
          *(undefined4 *)((long)pacVar18 + lVar24 + 0x260 + (long)*piVar12 * 0x5b0) =
               *(undefined4 *)((long)piVar12 + lVar24 + 0x70);
          lVar24 = lVar24 + 4;
          pacVar19 = pacVar19 + 1;
        } while (lVar24 != 0x18);
        iVar16 = (*(this->m_pFriends->super_IInterface)._vptr_IInterface[6])
                           (this->m_pFriends,this->m_aClients + *piVar12,
                            this->m_aClients[*piVar12].m_aClan,1);
        iVar7 = *piVar12;
        this->m_aClients[iVar7].m_Friend = SUB41(iVar16,0);
        iVar7 = (*(this->m_pBlacklist->super_IInterface)._vptr_IInterface[3])
                          (this->m_pBlacklist,this->m_aClients + iVar7,
                           this->m_aClients[iVar7].m_aClan,1);
        this->m_aClients[*piVar12].m_ChatIgnore = SUB41(iVar7,0);
        if (SUB41(iVar7,0) != false) {
          GetPlayerLabel(this,local_188,0x40,*piVar12,this->m_aClients[*piVar12].m_aName);
          pcVar10 = Localize("%s is muted by you","");
          str_format((char *)&local_148,0x80,pcVar10);
          CChat::AddLine(this->m_pChat,(char *)&local_148,-2,0,-1);
        }
        CClientData::UpdateRenderInfo(this->m_aClients + *piVar12,this,*piVar12,true);
        piVar1 = &(this->m_GameInfo).m_NumPlayers;
        *piVar1 = *piVar1 + 1;
        lVar24 = (long)this->m_aClients[*piVar12].m_Team;
        if (lVar24 != -1) {
          piVar1 = (this->m_GameInfo).m_aTeamSize + lVar24;
          *piVar1 = *piVar1 + 1;
        }
        pCVar23 = this->m_pStats;
        iVar7 = *piVar12;
        iVar16 = piVar12[2];
        goto LAB_0018460d;
      }
      if (this->m_pConfig->m_Debug == 0) goto switchD_00183cfd_caseD_1;
      pIVar22 = this->m_pConsole;
      pp_Var15 = (pIVar22->super_IInterface)._vptr_IInterface;
      pcVar10 = "invalid local clientinfo";
    }
    goto LAB_00183e16;
  case 0xf:
switchD_00183cfd_caseD_f:
    pIVar2 = this->m_pClient;
    if (pIVar2->m_State != 4) {
      (*(pIVar2->super_IInterface)._vptr_IInterface[9])(pIVar2,0);
      iVar7 = piVar12[1];
      iVar16 = piVar12[2];
      iVar6 = piVar12[3];
      (this->m_GameInfo).m_GameFlags = piVar12[0];
      (this->m_GameInfo).m_ScoreLimit = iVar7;
      (this->m_GameInfo).m_TimeLimit = iVar16;
      (this->m_GameInfo).m_MatchNum = iVar6;
      (this->m_GameInfo).m_MatchCurrent = piVar12[4];
      goto switchD_00183cfd_caseD_1;
    }
    if (0x10 < MsgId) {
      if (MsgId != 0x17) {
        if (MsgId != 0x16) {
          if (MsgId != 0x11) goto switchD_00183cfd_caseD_1;
          goto switchD_00183cfd_caseD_d;
        }
        goto switchD_00183cfd_caseD_12;
      }
      goto switchD_00183cfd_caseD_13;
    }
LAB_00183ef6:
    if (MsgId != 4) {
      if (MsgId != 8) {
        if (MsgId != 10) goto switchD_00183cfd_caseD_1;
        goto switchD_00183cfd_caseD_6;
      }
      goto switchD_00183cfd_caseD_4;
    }
    break;
  case 0x10:
switchD_00183cfd_caseD_10:
    pIVar2 = this->m_pClient;
    if (pIVar2->m_State == 4) {
      if (0x10 < MsgId) {
        switch(MsgId) {
        case 0x11:
          goto switchD_00183cfd_caseD_d;
        case 0x12:
        case 0x14:
        case 0x15:
          goto switchD_00183cfd_caseD_1;
        case 0x13:
          goto switchD_00183cfd_caseD_f;
        case 0x16:
          goto switchD_00183cfd_caseD_12;
        case 0x17:
          goto switchD_00183cfd_caseD_13;
        default:
          goto switchD_00183cfd_default;
        }
      }
      goto LAB_00183ef6;
    }
    (*(pIVar2->super_IInterface)._vptr_IInterface[9])(pIVar2,0);
    iVar7 = *piVar12;
    if ((this->m_LocalClientID == iVar7) || (this->m_aClients[iVar7].m_Active == false)) {
      if (this->m_pConfig->m_Debug == 0) goto switchD_00183cfd_caseD_1;
      pIVar22 = this->m_pConsole;
      pp_Var15 = (pIVar22->super_IInterface)._vptr_IInterface;
      pcVar10 = "invalid clientdrop";
      goto LAB_00183e16;
    }
    if (piVar12[4] == 0) {
      DoLeaveMessage(this,this->m_aClients[iVar7].m_aName,iVar7,*(char **)(piVar12 + 2));
      local_148.m_pName = this->m_aClients[*piVar12].m_aName;
      local_148.m_ClientID = *piVar12;
      local_148.m_pReason = *(char **)(piVar12 + 2);
      IClient::SendPackMsg<CNetMsg_De_ClientLeave>(this->m_pClient,&local_148,0x18);
    }
    piVar1 = &(this->m_GameInfo).m_NumPlayers;
    *piVar1 = *piVar1 + -1;
    lVar24 = (long)this->m_aClients[*piVar12].m_Team;
    if (lVar24 != -1) {
      piVar1 = (this->m_GameInfo).m_aTeamSize + lVar24;
      *piVar1 = *piVar1 + -1;
    }
    CClientData::Reset(this->m_aClients + *piVar12,this,*piVar12);
    pCVar23 = this->m_pStats;
    iVar7 = *piVar12;
    goto LAB_00184220;
  case 0x12:
switchD_00183cfd_caseD_12:
    if (this->m_pClient->m_State == 4) {
      DoEnterMessage(this,*(char **)piVar12,piVar12[2],piVar12[3]);
      pCVar23 = this->m_pStats;
      iVar7 = piVar12[2];
      iVar16 = piVar12[3];
LAB_0018460d:
      CStats::OnPlayerEnter(pCVar23,iVar7,iVar16);
      goto switchD_00183cfd_caseD_1;
    }
LAB_001841e7:
    if (MsgId != 0x17) goto switchD_00183cfd_caseD_1;
  case 0x13:
switchD_00183cfd_caseD_13:
    if (this->m_pClient->m_State == 4) {
      DoLeaveMessage(this,*(char **)piVar12,piVar12[2],*(char **)(piVar12 + 4));
      pCVar23 = this->m_pStats;
      iVar7 = piVar12[2];
LAB_00184220:
      CStats::OnPlayerLeave(pCVar23,iVar7);
    }
    goto switchD_00183cfd_caseD_1;
  default:
switchD_00183cfd_default:
    if ((MsgId != 0x21) || (pIVar2 = this->m_pClient, pIVar2->m_State == 4))
    goto switchD_00183cfd_caseD_1;
    (*(pIVar2->super_IInterface)._vptr_IInterface[9])(pIVar2,0);
    if (this->m_aClients[*piVar12].m_Active == true) {
      pacVar19 = this->m_aClients[0].m_aaSkinPartNames;
      lVar24 = 0;
      pacVar18 = pacVar19;
      do {
        str_utf8_copy_num((char *)((long)*piVar12 * 0x5b0 + (long)pacVar18),
                          *(char **)((long)piVar12 + lVar24 * 2 + 8),0x61,0x18);
        *(undefined4 *)((long)pacVar19 + lVar24 + 0x248 + (long)*piVar12 * 0x5b0) =
             *(undefined4 *)((long)piVar12 + lVar24 + 0x38);
        *(undefined4 *)((long)pacVar19 + lVar24 + 0x260 + (long)*piVar12 * 0x5b0) =
             *(undefined4 *)((long)piVar12 + lVar24 + 0x50);
        lVar24 = lVar24 + 4;
        pacVar18 = pacVar18 + 1;
      } while (lVar24 != 0x18);
      CClientData::UpdateRenderInfo(this->m_aClients + *piVar12,this,*piVar12,true);
      goto switchD_00183cfd_caseD_1;
    }
    if (this->m_pConfig->m_Debug == 0) goto switchD_00183cfd_caseD_1;
    pIVar22 = this->m_pConsole;
    pp_Var15 = (pIVar22->super_IInterface)._vptr_IInterface;
    pcVar10 = "invalid skin info";
LAB_00183e16:
    (*pp_Var15[0x19])(pIVar22,1,"client",pcVar10,0);
    goto switchD_00183cfd_caseD_1;
  }
switchD_00183cfd_caseD_0:
  if (this->m_pClient->m_State != 4) {
    lVar24 = (long)this->m_aClients[*piVar12].m_Team;
    if (lVar24 != -1) {
      piVar1 = (this->m_GameInfo).m_aTeamSize + lVar24;
      *piVar1 = *piVar1 + -1;
    }
    iVar7 = piVar12[1];
    this->m_aClients[*piVar12].m_Team = iVar7;
    if ((long)iVar7 != -1) {
      piVar1 = (this->m_GameInfo).m_aTeamSize + iVar7;
      *piVar1 = *piVar1 + 1;
    }
    CClientData::UpdateRenderInfo(this->m_aClients + *piVar12,this,*piVar12,false);
    if (*piVar12 == this->m_LocalClientID) {
      this->m_TeamCooldownTick = piVar12[3];
      this->m_TeamChangeTime = this->m_pClient->m_LocalTime;
    }
  }
  if (piVar12[2] == 0) {
    DoTeamChangeMessage(this,this->m_aClients[*piVar12].m_aName,*piVar12,piVar12[1]);
  }
switchD_00183cfd_caseD_1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::OnMessage(int MsgId, CUnpacker *pUnpacker)
{
	Client()->RecordGameMessage(true);

	// special messages
	if(MsgId == NETMSGTYPE_SV_TUNEPARAMS && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		// unpack the new tuning
		CTuningParams NewTuning;
		int *pParams = (int *)&NewTuning;
		for(unsigned i = 0; i < sizeof(CTuningParams)/sizeof(int); i++)
			pParams[i] = pUnpacker->GetInt();

		// check for unpacking errors
		if(pUnpacker->Error())
			return;

		m_ServerMode = SERVERMODE_PURE;

		// apply new tuning
		m_Tuning = NewTuning;
		return;
	}
	else if(MsgId == NETMSGTYPE_SV_VOTEOPTIONLISTADD)
	{
		int NumOptions = pUnpacker->GetInt();
		for(int i = 0; i < NumOptions; i++)
		{
			const char *pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC);
			if(pUnpacker->Error())
				return;

			m_pVoting->AddOption(pDescription);
		}
	}
	else if(MsgId == NETMSGTYPE_SV_GAMEMSG)
	{
		int GameMsgID = pUnpacker->GetInt();

		// check for valid gamemsgid
		if(GameMsgID < 0 || GameMsgID >= NUM_GAMEMSGS)
			return;

		int aParaI[3];
		int NumParaI = 0;

		// get paras
		switch(gs_GameMsgList[GameMsgID].m_ParaType)
		{
		case PARA_I: NumParaI = 1; break;
		case PARA_II: NumParaI = 2; break;
		case PARA_III: NumParaI = 3; break;
		}
		for(int i = 0; i < NumParaI; i++)
		{
			aParaI[i] = pUnpacker->GetInt();
		}

		// check for unpacking errors
		if(pUnpacker->Error())
			return;

		// handle special messages
		char aBuf[256];
		bool TeamPlay = m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS;
		if(gs_GameMsgList[GameMsgID].m_Action == DO_SPECIAL)
		{
			switch(GameMsgID)
			{
			case GAMEMSG_CTF_DROP:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_DROP);
				break;
			case GAMEMSG_CTF_RETURN:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_RETURN);
				break;
			case GAMEMSG_TEAM_ALL:
				{
					const char *pMsg = "";
					switch(GetStrTeam(aParaI[0], TeamPlay))
					{
					case STR_TEAM_GAME: pMsg = Localize("All players were moved to the game"); break;
					case STR_TEAM_RED: pMsg = Localize("All players were moved to the red team"); break;
					case STR_TEAM_BLUE: pMsg = Localize("All players were moved to the blue team"); break;
					case STR_TEAM_SPECTATORS: pMsg = Localize("All players were moved to the spectators"); break;
					}
					m_pBroadcast->DoClientBroadcast(pMsg);
				}
				break;
			case GAMEMSG_TEAM_BALANCE_VICTIM:
				{
					const char *pMsg = "";
					switch(GetStrTeam(aParaI[0], TeamPlay))
					{
					case STR_TEAM_RED: pMsg = Localize("You were moved to the red team due to team balancing"); break;
					case STR_TEAM_BLUE: pMsg = Localize("You were moved to the blue team due to team balancing"); break;
					}
					m_pBroadcast->DoClientBroadcast(pMsg);
				}
				break;
			case GAMEMSG_CTF_GRAB:
				if(m_LocalClientID != -1 && (m_aClients[m_LocalClientID].m_Team != aParaI[0] || (m_Snap.m_SpecInfo.m_Active &&
								((m_Snap.m_SpecInfo.m_SpectatorID != -1 && m_aClients[m_Snap.m_SpecInfo.m_SpectatorID].m_Team != aParaI[0]) ||
								(m_Snap.m_SpecInfo.m_SpecMode == SPEC_FLAGRED && aParaI[0] != TEAM_RED) ||
								(m_Snap.m_SpecInfo.m_SpecMode == SPEC_FLAGBLUE && aParaI[0] != TEAM_BLUE)))))
					m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_GRAB_PL);
				else
					m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_GRAB_EN);
				break;
			case GAMEMSG_GAME_PAUSED:
				{
					int ClientID = clamp(aParaI[0], 0, MAX_CLIENTS - 1);
					char aLabel[64];
					GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, m_aClients[ClientID].m_aName);
					str_format(aBuf, sizeof(aBuf), Localize("'%s' initiated a pause"), aLabel);
					m_pChat->AddLine(aBuf);
				}
				break;
			case GAMEMSG_CTF_CAPTURE:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_CAPTURE);
				int ClientID = clamp(aParaI[1], 0, MAX_CLIENTS - 1);
				m_pStats->OnFlagCapture(ClientID);
				char aLabel[64];
				GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, m_aClients[ClientID].m_aName);

				float Time = aParaI[2] / (float)Client()->GameTickSpeed();
				if(Time <= 60)
				{
					if(aParaI[0])
					{
						str_format(aBuf, sizeof(aBuf), Localize("The blue flag was captured by '%s' (%.2f seconds)"), aLabel, Time);
					}
					else
					{
						str_format(aBuf, sizeof(aBuf), Localize("The red flag was captured by '%s' (%.2f seconds)"), aLabel, Time);
					}
				}
				else
				{
					if(aParaI[0])
					{
						str_format(aBuf, sizeof(aBuf), Localize("The blue flag was captured by '%s'"), aLabel);
					}
					else
					{
						str_format(aBuf, sizeof(aBuf), Localize("The red flag was captured by '%s'"), aLabel);
					}
				}
				m_pChat->AddLine(aBuf);
			}
			return;
		}

		// build message
		const char *pText = "";
		if(NumParaI == 0)
		{
			pText = Localize(gs_GameMsgList[GameMsgID].m_pText);
		}

		// handle message
		switch(gs_GameMsgList[GameMsgID].m_Action)
		{
		case DO_CHAT:
			m_pChat->AddLine(pText);
			break;
		case DO_BROADCAST:
			m_pBroadcast->DoClientBroadcast(pText);
			break;
		}
	}

	void *pRawMsg = m_NetObjHandler.SecureUnpackMsg(MsgId, pUnpacker);
	if(!pRawMsg)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "dropped weird message '%s' (%d), failed on '%s'", m_NetObjHandler.GetMsgName(MsgId), MsgId, m_NetObjHandler.FailedMsgOn());
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
		return;
	}

	// TODO: this should be done smarter
	for(int i = 0; i < m_All.m_Num; i++)
		m_All.m_paComponents[i]->OnMessage(MsgId, pRawMsg);

	if(MsgId == NETMSGTYPE_SV_CLIENTINFO && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ClientInfo *pMsg = (CNetMsg_Sv_ClientInfo *)pRawMsg;

		if(pMsg->m_Local)
		{
			if(m_LocalClientID != -1)
			{
				if(Config()->m_Debug)
					Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid local clientinfo");
				return;
			}
			m_LocalClientID = pMsg->m_ClientID;
			m_TeamChangeTime = Client()->LocalTime();
		}
		else
		{
			if(m_aClients[pMsg->m_ClientID].m_Active)
			{
				if(Config()->m_Debug)
					Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid clientinfo");
				return;
			}

			if(m_LocalClientID != -1 && !pMsg->m_Silent)
			{
				DoEnterMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_Team);

				if(m_pDemoRecorder->IsRecording())
				{
					CNetMsg_De_ClientEnter Msg;
					Msg.m_pName = pMsg->m_pName;
					Msg.m_ClientID = pMsg->m_ClientID;
					Msg.m_Team = pMsg->m_Team;
					Client()->SendPackMsg(&Msg, MSGFLAG_NOSEND|MSGFLAG_RECORD);
				}
			}
		}

		m_aClients[pMsg->m_ClientID].m_Active = true;
		m_aClients[pMsg->m_ClientID].m_Team  = pMsg->m_Team;
		str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_pName, sizeof(m_aClients[pMsg->m_ClientID].m_aName), MAX_NAME_LENGTH);
		str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aClan, pMsg->m_pClan, sizeof(m_aClients[pMsg->m_ClientID].m_aClan), MAX_CLAN_LENGTH);
		m_aClients[pMsg->m_ClientID].m_Country = pMsg->m_Country;
		for(int i = 0; i < NUM_SKINPARTS; i++)
		{
			str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i], pMsg->m_apSkinPartNames[i], sizeof(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i]), MAX_SKIN_LENGTH);
			m_aClients[pMsg->m_ClientID].m_aUseCustomColors[i] = pMsg->m_aUseCustomColors[i];
			m_aClients[pMsg->m_ClientID].m_aSkinPartColors[i] = pMsg->m_aSkinPartColors[i];
		}

		// update friend state
		m_aClients[pMsg->m_ClientID].m_Friend = Friends()->IsFriend(m_aClients[pMsg->m_ClientID].m_aName, m_aClients[pMsg->m_ClientID].m_aClan, true);
		// update chat ignore state
		m_aClients[pMsg->m_ClientID].m_ChatIgnore = Blacklist()->IsIgnored(m_aClients[pMsg->m_ClientID].m_aName, m_aClients[pMsg->m_ClientID].m_aClan, true);
		if(m_aClients[pMsg->m_ClientID].m_ChatIgnore)
		{
			char aBuf[128];
			char aLabel[64];
			GetPlayerLabel(aLabel, sizeof(aLabel), pMsg->m_ClientID, m_aClients[pMsg->m_ClientID].m_aName);
			str_format(aBuf, sizeof(aBuf), Localize("%s is muted by you"), aLabel);
			m_pChat->AddLine(aBuf, CChat::CLIENT_MSG);
		}

		m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, true);

		m_GameInfo.m_NumPlayers++;
		// calculate team-balance
		if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
			m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]++;

		m_pStats->OnPlayerEnter(pMsg->m_ClientID, pMsg->m_Team);
	}
	else if(MsgId == NETMSGTYPE_SV_CLIENTDROP && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ClientDrop *pMsg = (CNetMsg_Sv_ClientDrop *)pRawMsg;

		if(m_LocalClientID == pMsg->m_ClientID || !m_aClients[pMsg->m_ClientID].m_Active)
		{
			if(Config()->m_Debug)
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid clientdrop");
			return;
		}

		if(!pMsg->m_Silent)
		{
			DoLeaveMessage(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_ClientID, pMsg->m_pReason);

			CNetMsg_De_ClientLeave Msg;
			Msg.m_pName = m_aClients[pMsg->m_ClientID].m_aName;
			Msg.m_ClientID = pMsg->m_ClientID;
			Msg.m_pReason = pMsg->m_pReason;
			Client()->SendPackMsg(&Msg, MSGFLAG_NOSEND | MSGFLAG_RECORD);
		}

		m_GameInfo.m_NumPlayers--;
		// calculate team-balance
		if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
			m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]--;

		m_aClients[pMsg->m_ClientID].Reset(this, pMsg->m_ClientID);
		m_pStats->OnPlayerLeave(pMsg->m_ClientID);
	}
	else if(MsgId == NETMSGTYPE_SV_SKINCHANGE && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_SkinChange *pMsg = (CNetMsg_Sv_SkinChange *)pRawMsg;

		if(!m_aClients[pMsg->m_ClientID].m_Active)
		{
			if(Config()->m_Debug)
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid skin info");
			return;
		}

		for(int i = 0; i < NUM_SKINPARTS; i++)
		{
			str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i], pMsg->m_apSkinPartNames[i], sizeof(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i]), MAX_SKIN_LENGTH);
			m_aClients[pMsg->m_ClientID].m_aUseCustomColors[i] = pMsg->m_aUseCustomColors[i];
			m_aClients[pMsg->m_ClientID].m_aSkinPartColors[i] = pMsg->m_aSkinPartColors[i];
		}
		m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, true);
	}
	else if(MsgId == NETMSGTYPE_SV_GAMEINFO && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_GameInfo *pMsg = (CNetMsg_Sv_GameInfo *)pRawMsg;

		m_GameInfo.m_GameFlags = pMsg->m_GameFlags;
		m_GameInfo.m_ScoreLimit = pMsg->m_ScoreLimit;
		m_GameInfo.m_TimeLimit = pMsg->m_TimeLimit;
		m_GameInfo.m_MatchNum = pMsg->m_MatchNum;
		m_GameInfo.m_MatchCurrent = pMsg->m_MatchCurrent;
	}
	else if(MsgId == NETMSGTYPE_SV_SERVERSETTINGS && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ServerSettings *pMsg = (CNetMsg_Sv_ServerSettings *)pRawMsg;

		if(!m_ServerSettings.m_TeamLock && pMsg->m_TeamLock)
			m_pChat->AddLine(Localize("Teams were locked"));
		else if(m_ServerSettings.m_TeamLock && !pMsg->m_TeamLock)
			m_pChat->AddLine(Localize("Teams were unlocked"));

		m_ServerSettings.m_KickVote = pMsg->m_KickVote;
		m_ServerSettings.m_KickMin = pMsg->m_KickMin;
		m_ServerSettings.m_SpecVote = pMsg->m_SpecVote;
		m_ServerSettings.m_TeamLock = pMsg->m_TeamLock;
		m_ServerSettings.m_TeamBalance = pMsg->m_TeamBalance;
		m_ServerSettings.m_PlayerSlots = pMsg->m_PlayerSlots;
	}
	else if(MsgId == NETMSGTYPE_SV_TEAM)
	{
		CNetMsg_Sv_Team *pMsg = (CNetMsg_Sv_Team *)pRawMsg;

		if(Client()->State() != IClient::STATE_DEMOPLAYBACK)
		{
			// calculate team-balance
			if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
				m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]--;
			m_aClients[pMsg->m_ClientID].m_Team = pMsg->m_Team;
			if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
				m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]++;

			m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, false);

			if(pMsg->m_ClientID == m_LocalClientID)
			{
				m_TeamCooldownTick = pMsg->m_CooldownTick;
				m_TeamChangeTime = Client()->LocalTime();
			}
		}

		if(pMsg->m_Silent == 0)
		{
			DoTeamChangeMessage(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_ClientID, pMsg->m_Team);
		}
	}
	else if(MsgId == NETMSGTYPE_SV_READYTOENTER)
	{
		Client()->EnterGame();
	}
	else if (MsgId == NETMSGTYPE_SV_EMOTICON)
	{
		CNetMsg_Sv_Emoticon *pMsg = (CNetMsg_Sv_Emoticon *)pRawMsg;

		// apply
		m_aClients[pMsg->m_ClientID].m_Emoticon = pMsg->m_Emoticon;
		m_aClients[pMsg->m_ClientID].m_EmoticonStart = Client()->GameTick();
	}
	else if(MsgId == NETMSGTYPE_DE_CLIENTENTER && Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		CNetMsg_De_ClientEnter *pMsg = (CNetMsg_De_ClientEnter *)pRawMsg;
		DoEnterMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_Team);
		m_pStats->OnPlayerEnter(pMsg->m_ClientID, pMsg->m_Team);
	}
	else if(MsgId == NETMSGTYPE_DE_CLIENTLEAVE && Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		CNetMsg_De_ClientLeave *pMsg = (CNetMsg_De_ClientLeave *)pRawMsg;
		DoLeaveMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_pReason);
		m_pStats->OnPlayerLeave(pMsg->m_ClientID);
	}
}